

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReaderCache::setSearchPath(PtexReaderCache *this,char *path)

{
  ulong uVar1;
  allocator<char> *in_RSI;
  char *in_RDI;
  int len;
  char *delim;
  char *cp;
  value_type *in_stack_ffffffffffffff38;
  allocator<char> *in_stack_ffffffffffffff40;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_78 [32];
  int local_58;
  allocator<char> local_41;
  string local_40 [32];
  char *local_20;
  allocator<char> *local_18;
  allocator<char> *local_10;
  
  __a = in_RSI;
  if (in_RSI == (allocator<char> *)0x0) {
    __a = (allocator<char> *)0x100094e;
  }
  local_10 = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),(char *)__a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0xaed6fd);
  if (local_10 != (allocator<char> *)0x0) {
    local_18 = local_10;
    while (local_20 = strchr((char *)local_18,0x3a), local_20 != (char *)0x0) {
      local_58 = (int)local_20 - (int)local_18;
      if (local_58 != 0) {
        in_stack_ffffffffffffff38 = (value_type *)(in_RDI + 0x48);
        uVar1 = (ulong)local_58;
        in_stack_ffffffffffffff40 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_78,(char *)in_stack_ffffffffffffff40,uVar1,
                   (allocator *)&stack0xffffffffffffff87);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        std::__cxx11::string::~string(local_78);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
      }
      local_18 = (allocator<char> *)(local_20 + 1);
    }
    if (*local_18 != (allocator<char>)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff80,in_RDI,__a);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator(&local_41);
    }
  }
  return;
}

Assistant:

virtual void setSearchPath(const char* path)
    {
        // record path
        _searchpath = path ? path : "";

        // split into dirs
        _searchdirs.clear();

        if (path) {
            const char* cp = path;
            while (1) {
                const char* delim = strchr(cp, ':');
                if (!delim) {
                    if (*cp) _searchdirs.push_back(cp);
                    break;
                }
                int len = int(delim-cp);
                if (len) _searchdirs.push_back(std::string(cp, len));
                cp = delim+1;
            }
        }
    }